

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void bcd_add_mag(ppc_avr_t *t,ppc_avr_t *a,ppc_avr_t *b,int *invalid,int *overflow)

{
  bool bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  byte local_39;
  int local_38;
  uint uStack_34;
  uint8_t digit;
  int i;
  int carry;
  int *overflow_local;
  int *invalid_local;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *t_local;
  
  uStack_34 = 0;
  for (local_38 = 1; local_38 < 0x20; local_38 = local_38 + 1) {
    uVar2 = bcd_get_digit(a,local_38,invalid);
    uVar3 = bcd_get_digit(b,local_38,invalid);
    local_39 = uVar2 + uVar3 + (char)uStack_34;
    bVar1 = 9 < local_39;
    if (bVar1) {
      local_39 = local_39 - 10;
    }
    uStack_34 = (uint)bVar1;
    bcd_put_digit(t,local_39,local_38);
  }
  *overflow = uStack_34;
  return;
}

Assistant:

static void bcd_add_mag(ppc_avr_t *t, ppc_avr_t *a, ppc_avr_t *b, int *invalid,
                       int *overflow)
{
    int carry = 0;
    int i;
    for (i = 1; i <= 31; i++) {
        uint8_t digit = bcd_get_digit(a, i, invalid) +
                        bcd_get_digit(b, i, invalid) + carry;
        if (digit > 9) {
            carry = 1;
            digit -= 10;
        } else {
            carry = 0;
        }

        bcd_put_digit(t, digit, i);
    }

    *overflow = carry;
}